

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsVariable.h
# Opt level: O0

void __thiscall
AdsVariable<unsigned_char>::Read(AdsVariable<unsigned_char> *this,size_t size,void *data)

{
  uint uVar1;
  AdsDevice *pAVar2;
  type puVar3;
  long adsErrorCode;
  AdsException *this_00;
  long error;
  uint32_t bytesRead;
  void *data_local;
  size_t size_local;
  AdsVariable<unsigned_char> *this_local;
  
  pAVar2 = this->m_Route;
  uVar1 = this->m_IndexGroup;
  puVar3 = std::unique_ptr<unsigned_int,_ResourceDeleter<unsigned_int>_>::operator*(&this->m_Handle)
  ;
  adsErrorCode = AdsDevice::ReadReqEx2((uint)pAVar2,uVar1,(ulong)*puVar3,(void *)size,(uint *)data);
  if ((adsErrorCode == 0) && (size == 0)) {
    return;
  }
  this_00 = (AdsException *)__cxa_allocate_exception(0x30);
  AdsException::AdsException(this_00,adsErrorCode);
  __cxa_throw(this_00,&AdsException::typeinfo,AdsException::~AdsException);
}

Assistant:

void Read(const size_t size, void* data) const
    {
        uint32_t bytesRead = 0;
        auto error = m_Route.ReadReqEx2(m_IndexGroup,
                                        *m_Handle,
                                        size,
                                        data,
                                        &bytesRead);

        if (error || (size != bytesRead)) {
            throw AdsException(error);
        }
    }